

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int cmd_getsearchpath(char *args)

{
  char *__s;
  long lVar1;
  undefined8 uVar2;
  ulong uVar3;
  
  lVar1 = PHYSFS_getSearchPath();
  if (lVar1 == 0) {
    uVar2 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar2);
  }
  else {
    for (uVar3 = 0; __s = *(char **)(lVar1 + uVar3 * 8), __s != (char *)0x0; uVar3 = uVar3 + 1) {
      puts(__s);
    }
    printf("\n total (%d) directories.\n",uVar3 & 0xffffffff);
    PHYSFS_freeList(lVar1);
  }
  return 1;
}

Assistant:

static int cmd_getsearchpath(char *args)
{
    char **rc = PHYSFS_getSearchPath();

    if (rc == NULL)
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());
    else
    {
        int dir_count;
        char **i;
        for (i = rc, dir_count = 0; *i != NULL; i++, dir_count++)
            printf("%s\n", *i);

        printf("\n total (%d) directories.\n", dir_count);
        PHYSFS_freeList(rc);
    } /* else */

    return 1;
}